

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsort.c
# Opt level: O3

saint_t divsufsort(sauchar_t *T,saidx_t *SA,saidx_t n)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  saidx_t sVar5;
  saidx_t *bucket_A;
  saidx_t *bucket_B;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  saint_t sVar10;
  uint *puVar11;
  uint uVar12;
  uint *puVar13;
  bool bVar15;
  ulong uVar14;
  
  sVar10 = -1;
  if (-1 < n && (SA != (saidx_t *)0x0 && T != (sauchar_t *)0x0)) {
    if (n == 0) {
      sVar10 = 0;
    }
    else {
      if (n == 2) {
        bVar2 = *T;
        bVar1 = T[1];
        SA[bVar2 >= bVar1] = 0;
        SA[bVar2 < bVar1] = 1;
      }
      else {
        if (n != 1) {
          bucket_A = (saidx_t *)malloc(0x400);
          bucket_B = (saidx_t *)malloc(0x40000);
          sVar10 = -2;
          if (bucket_B != (saidx_t *)0x0 && bucket_A != (saidx_t *)0x0) {
            sVar5 = sort_typeBstar(T,SA,bucket_A,bucket_B,n);
            if (0 < sVar5) {
              lVar7 = 0xfe;
              do {
                uVar8 = (int)lVar7 << 8;
                iVar3 = bucket_B[(int)((int)lVar7 + 1U | uVar8)];
                puVar13 = (uint *)(SA + (long)bucket_A[lVar7 + 1] + -1);
                if (SA + iVar3 <= puVar13) {
                  uVar12 = 0xffffffff;
                  puVar11 = (uint *)0x0;
                  do {
                    uVar4 = *puVar13;
                    *puVar13 = ~uVar4;
                    if (0 < (long)(int)uVar4) {
                      bVar2 = T[uVar4 - 1];
                      uVar6 = (ulong)bVar2;
                      uVar9 = 0;
                      if ((uVar4 != 1) && (uVar9 = uVar4 - 1, bVar2 < T[(long)(int)uVar4 + -2])) {
                        uVar9 = -uVar4;
                      }
                      if (uVar12 == bVar2) {
                        uVar6 = (ulong)uVar12;
                      }
                      else {
                        if (-1 < (int)uVar12) {
                          bucket_B[(int)(uVar12 | uVar8)] =
                               (saidx_t)((ulong)((long)puVar11 - (long)SA) >> 2);
                        }
                        puVar11 = (uint *)(SA + bucket_B[(long)(int)uVar8 | uVar6]);
                      }
                      *puVar11 = uVar9;
                      puVar11 = puVar11 + -1;
                      uVar12 = (uint)uVar6;
                    }
                    puVar13 = puVar13 + -1;
                  } while (SA + iVar3 <= puVar13);
                }
                bVar15 = lVar7 != 0;
                lVar7 = lVar7 + -1;
              } while (bVar15);
            }
            uVar6 = (ulong)T[n - 1U];
            uVar8 = -n;
            if (T[n - 1U] <= T[(ulong)(uint)n - 2]) {
              uVar8 = n - 1U;
            }
            iVar3 = bucket_A[uVar6];
            SA[iVar3] = uVar8;
            sVar10 = 0;
            if (n != 0) {
              puVar13 = (uint *)(SA + (long)iVar3 + 1);
              puVar11 = (uint *)SA;
              do {
                uVar8 = *puVar11;
                if ((long)(int)uVar8 < 1) {
                  *puVar11 = ~uVar8;
                }
                else {
                  uVar12 = uVar8 - 1;
                  uVar14 = (ulong)uVar12;
                  if ((uVar12 == 0) || (T[(long)(int)uVar8 + -2] < T[uVar14])) {
                    uVar12 = -uVar8;
                  }
                  uVar8 = (uint)T[uVar14];
                  if ((uint)uVar6 != uVar8) {
                    bucket_A[uVar6] = (saidx_t)((ulong)((long)puVar13 - (long)SA) >> 2);
                    puVar13 = (uint *)(SA + bucket_A[uVar8]);
                    uVar6 = (ulong)uVar8;
                  }
                  *puVar13 = uVar12;
                  puVar13 = puVar13 + 1;
                }
                puVar11 = puVar11 + 1;
              } while (puVar11 < SA + (uint)n);
            }
          }
          free(bucket_B);
          free(bucket_A);
          return sVar10;
        }
        *SA = 0;
      }
      sVar10 = 0;
    }
  }
  return sVar10;
}

Assistant:

saint_t
divsufsort(const sauchar_t *T, saidx_t *SA, saidx_t n) {
  saidx_t *bucket_A, *bucket_B;
  saidx_t m;
  saint_t err = 0;

  /* Check arguments. */
  if((T == NULL) || (SA == NULL) || (n < 0)) { return -1; }
  else if(n == 0) { return 0; }
  else if(n == 1) { SA[0] = 0; return 0; }
  else if(n == 2) { m = (T[0] < T[1]); SA[m ^ 1] = 0, SA[m] = 1; return 0; }

  bucket_A = (saidx_t *)malloc(BUCKET_A_SIZE * sizeof(saidx_t));
  bucket_B = (saidx_t *)malloc(BUCKET_B_SIZE * sizeof(saidx_t));

  /* Suffixsort. */
  if((bucket_A != NULL) && (bucket_B != NULL)) {
    m = sort_typeBstar(T, SA, bucket_A, bucket_B, n);
    construct_SA(T, SA, bucket_A, bucket_B, n, m);
  } else {
    err = -2;
  }

  free(bucket_B);
  free(bucket_A);

  return err;
}